

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsElfFile.cpp
# Opt level: O2

void __thiscall
DirectiveLoadMipsElf::DirectiveLoadMipsElf(DirectiveLoadMipsElf *this,path *fileName)

{
  path *this_00;
  shared_ptr<MipsElfFile> *this_01;
  FileManager *this_02;
  bool bVar1;
  size_type *this_03;
  path local_68;
  __shared_ptr<AssemblerFile,(__gnu_cxx::_Lock_policy)2> local_40 [8];
  size_type local_38;
  
  CAssemblerCommand::CAssemblerCommand(&this->super_CAssemblerCommand);
  (this->super_CAssemblerCommand)._vptr_CAssemblerCommand =
       (_func_int **)&PTR__DirectiveLoadMipsElf_001bae08;
  (this->file).super___shared_ptr<MipsElfFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->file).super___shared_ptr<MipsElfFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = &this->inputName;
  ghc::filesystem::path::path(this_00);
  ghc::filesystem::path::path(&this->outputName);
  std::make_shared<MipsElfFile>();
  this_01 = &this->file;
  std::__shared_ptr<MipsElfFile,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&this_01->super___shared_ptr<MipsElfFile,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<MipsElfFile,_(__gnu_cxx::_Lock_policy)2> *)&local_68);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_68._path._M_string_length);
  getFullPathName(&local_68,fileName);
  ghc::filesystem::path::operator=(this_00,&local_68);
  ghc::filesystem::path::~path(&local_68);
  bVar1 = MipsElfFile::load((this_01->super___shared_ptr<MipsElfFile,_(__gnu_cxx::_Lock_policy)2>).
                            _M_ptr,this_00,this_00);
  this_02 = g_fileManager;
  if (bVar1) {
    std::__shared_ptr<AssemblerFile,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<MipsElfFile,void>
              (local_40,&this_01->super___shared_ptr<MipsElfFile,_(__gnu_cxx::_Lock_policy)2>);
    FileManager::addFile(this_02,(shared_ptr<AssemblerFile> *)local_40);
    this_03 = &local_38;
  }
  else {
    local_68._path._M_dataplus._M_p = (pointer)0x0;
    local_68._path._M_string_length = 0;
    std::__shared_ptr<MipsElfFile,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&this_01->super___shared_ptr<MipsElfFile,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<MipsElfFile,_(__gnu_cxx::_Lock_policy)2> *)&local_68);
    this_03 = &local_68._path._M_string_length;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)this_03);
  return;
}

Assistant:

DirectiveLoadMipsElf::DirectiveLoadMipsElf(const fs::path& fileName)
{
	file = std::make_shared<MipsElfFile>();

	this->inputName = getFullPathName(fileName);
	if (!file->load(this->inputName,this->inputName))
	{
		file = nullptr;
		return;
	}
	
	g_fileManager->addFile(file);
}